

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall nonius::junit_reporter::do_benchmark_failure(junit_reporter *this,exception_ptr *e)

{
  mapped_type *this_00;
  ostream *poVar1;
  result local_98;
  
  local_98.analysis.outliers.low_mild = 0;
  local_98.analysis.outliers.high_mild = 0;
  local_98.analysis.outliers.high_severe = 0;
  local_98.analysis._108_4_ = 0;
  local_98.analysis.standard_deviation.confidence_interval = 0.0;
  local_98.analysis.outliers.samples_seen = 0;
  local_98.analysis.outliers.low_severe = 0;
  local_98.analysis.standard_deviation.lower_bound.__r = 0.0;
  local_98.analysis.standard_deviation.upper_bound.__r = 0.0;
  local_98.analysis.mean.confidence_interval = 0.0;
  local_98.analysis.standard_deviation.point.__r = 0.0;
  local_98.analysis.mean.lower_bound.__r = 0.0;
  local_98.analysis.mean.upper_bound.__r = 0.0;
  local_98.analysis.samples.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.analysis.mean.point.__r = 0.0;
  local_98.analysis.samples.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.analysis.samples.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.analysis.outlier_variance = 0.0;
  std::__exception_ptr::exception_ptr::exception_ptr(&local_98.failure,e);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->data,&this->current);
  result::operator=(this_00,&local_98);
  result::~result(&local_98);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&this->current);
  std::operator<<(poVar1," failed to run successfully\n");
  return;
}

Assistant:

void do_benchmark_failure(std::exception_ptr e) override {
            data[current] = { sample_analysis<fp_seconds>(), e };
            error_stream() << current << " failed to run successfully\n";
        }